

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

int packet_queue_listener
              (LIBSSH2_SESSION *session,uchar *data,size_t datalen,
              packet_queue_listener_state_t *listen_state)

{
  int iVar1;
  uint32_t uVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 uVar5;
  LIBSSH2_CHANNEL *channel;
  string_buf buf;
  size_t temp_len;
  size_t offset;
  int rc;
  char failure_code;
  LIBSSH2_LISTENER *listn;
  uchar *p;
  size_t packet_len;
  packet_queue_listener_state_t *listen_state_local;
  size_t datalen_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  p = (uchar *)0x26;
  packet_len = (size_t)listen_state;
  listen_state_local = (packet_queue_listener_state_t *)datalen;
  datalen_local = (size_t)data;
  data_local = (uchar *)session;
  _rc = (list_node *)_libssh2_list_first(&session->listeners);
  offset._7_1_ = '\x01';
  if (*(int *)packet_len == 0) {
    buf.len = 0;
    channel = (LIBSSH2_CHANNEL *)datalen_local;
    buf.data = (uchar *)datalen_local;
    buf.dataptr = (uchar *)listen_state_local;
    if (listen_state_local < (packet_queue_listener_state_t *)0x14) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x29,"Unexpected packet size");
      return iVar1;
    }
    buf.data = (uchar *)(datalen_local + 0x14);
    iVar1 = _libssh2_get_u32((string_buf *)&channel,(uint32_t *)(packet_len + 0x40));
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting channel"
                            );
      return iVar1;
    }
    iVar1 = _libssh2_get_u32((string_buf *)&channel,(uint32_t *)(packet_len + 0x44));
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,
                             "Data too short extracting window size");
      return iVar1;
    }
    iVar1 = _libssh2_get_u32((string_buf *)&channel,(uint32_t *)(packet_len + 0x48));
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting packet")
      ;
      return iVar1;
    }
    iVar1 = _libssh2_get_string((string_buf *)&channel,(uchar **)(packet_len + 0x30),&buf.len);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting host");
      return iVar1;
    }
    *(int *)(packet_len + 0x54) = (int)buf.len;
    iVar1 = _libssh2_get_u32((string_buf *)&channel,(uint32_t *)(packet_len + 0x4c));
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting port");
      return iVar1;
    }
    iVar1 = _libssh2_get_string((string_buf *)&channel,(uchar **)(packet_len + 0x38),&buf.len);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting shost");
      return iVar1;
    }
    *(int *)(packet_len + 0x58) = (int)buf.len;
    iVar1 = _libssh2_get_u32((string_buf *)&channel,(uint32_t *)(packet_len + 0x50));
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,-0x26,"Data too short extracting sport");
      return iVar1;
    }
    *(undefined4 *)packet_len = 1;
  }
  if (*(int *)packet_len != 3) {
    for (; _rc != (list_node *)0x0; _rc = (list_node *)_libssh2_list_next(_rc)) {
      if (((*(int *)&_rc[1].head == *(int *)(packet_len + 0x4c)) &&
          (sVar3 = strlen((char *)_rc[1].prev), sVar3 == *(uint *)(packet_len + 0x54))) &&
         (iVar1 = memcmp(_rc[1].prev,*(void **)(packet_len + 0x30),
                         (ulong)*(uint *)(packet_len + 0x54)), iVar1 == 0)) {
        *(undefined8 *)(packet_len + 0x60) = 0;
        if (*(int *)packet_len == 1) {
          if ((*(int *)((long)&_rc[2].head + 4) != 0) &&
             (*(int *)((long)&_rc[2].head + 4) <= *(int *)&_rc[2].head)) {
            offset._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          pvVar4 = _libssh2_calloc((LIBSSH2_SESSION *)data_local,0x340);
          if (pvVar4 == (void *)0x0) {
            _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                           "Unable to allocate a channel for new connection");
            offset._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          *(void **)(packet_len + 0x60) = pvVar4;
          *(uchar **)((long)pvVar4 + 0x70) = data_local;
          *(undefined8 *)((long)pvVar4 + 0x20) = 0xf;
          uVar5 = (**(code **)(data_local + 8))(*(long *)((long)pvVar4 + 0x20) + 1,data_local);
          *(undefined8 *)((long)pvVar4 + 0x18) = uVar5;
          if (*(long *)((long)pvVar4 + 0x18) == 0) {
            _libssh2_error((LIBSSH2_SESSION *)data_local,-6,
                           "Unable to allocate a channel for new connection");
            (**(code **)(data_local + 0x18))(pvVar4,data_local);
            offset._7_1_ = '\x04';
            *(undefined4 *)packet_len = 3;
            break;
          }
          memcpy(*(void **)((long)pvVar4 + 0x18),"forwarded-tcpip",
                 *(long *)((long)pvVar4 + 0x20) + 1);
          *(undefined4 *)((long)pvVar4 + 0x4c) = *(undefined4 *)(packet_len + 0x40);
          *(undefined4 *)((long)pvVar4 + 0x50) = 0x200000;
          *(undefined4 *)((long)pvVar4 + 0x54) = 0x200000;
          *(undefined4 *)((long)pvVar4 + 0x58) = 0x8000;
          uVar2 = _libssh2_channel_nextid((LIBSSH2_SESSION *)data_local);
          *(uint32_t *)((long)pvVar4 + 0x38) = uVar2;
          *(undefined4 *)((long)pvVar4 + 0x3c) = *(undefined4 *)(packet_len + 0x44);
          *(undefined4 *)((long)pvVar4 + 0x40) = *(undefined4 *)(packet_len + 0x44);
          *(undefined4 *)((long)pvVar4 + 0x44) = *(undefined4 *)(packet_len + 0x48);
          listn = (LIBSSH2_LISTENER *)(packet_len + 5);
          *(undefined1 *)(packet_len + 4) = 0x5b;
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar4 + 0x4c));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar4 + 0x38));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar4 + 0x50));
          _libssh2_store_u32((uchar **)&listn,*(uint32_t *)((long)pvVar4 + 0x58));
          *(undefined4 *)packet_len = 2;
        }
        if (*(int *)packet_len == 2) {
          iVar1 = _libssh2_transport_send
                            ((LIBSSH2_SESSION *)data_local,(uchar *)(packet_len + 4),0x11,
                             (uchar *)0x0,0);
          if (iVar1 == -0x25) {
            return -0x25;
          }
          if (iVar1 != 0) {
            *(undefined4 *)packet_len = 0;
            iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_local,iVar1,
                                   "Unable to send channel open confirmation");
            return iVar1;
          }
          if (*(long *)(packet_len + 0x60) != 0) {
            _libssh2_list_add((list_head *)(_rc + 2),*(list_node **)(packet_len + 0x60));
            *(int *)&_rc[2].head = *(int *)&_rc[2].head + 1;
          }
          *(undefined4 *)packet_len = 0;
          return 0;
        }
      }
    }
    *(undefined4 *)packet_len = 3;
  }
  listn = (LIBSSH2_LISTENER *)(packet_len + 5);
  *(undefined1 *)(packet_len + 4) = 0x5c;
  _libssh2_store_u32((uchar **)&listn,*(uint32_t *)(packet_len + 0x40));
  _libssh2_store_u32((uchar **)&listn,(int)offset._7_1_);
  _libssh2_store_str((uchar **)&listn,"Forward not requested",0x15);
  _libssh2_htonu32((uchar *)listn,0);
  iVar1 = _libssh2_transport_send
                    ((LIBSSH2_SESSION *)data_local,(uchar *)(packet_len + 4),(size_t)p,(uchar *)0x0,
                     0);
  if (iVar1 == -0x25) {
    session_local._4_4_ = -0x25;
  }
  else if (iVar1 == 0) {
    *(undefined4 *)packet_len = 0;
    session_local._4_4_ = 0;
  }
  else {
    *(undefined4 *)packet_len = 0;
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_local,iVar1,"Unable to send open failure");
  }
  return session_local._4_4_;
}

Assistant:

static inline int
packet_queue_listener(LIBSSH2_SESSION * session, unsigned char *data,
                      size_t datalen,
                      packet_queue_listener_state_t *listen_state)
{
    /*
     * Look for a matching listener
     */
    /* 17 = packet_type(1) + channel(4) + reason(4) + descr(4) + lang(4) */
    size_t packet_len = 17 + strlen(FwdNotReq);
    unsigned char *p;
    LIBSSH2_LISTENER *listn = _libssh2_list_first(&session->listeners);
    char failure_code = SSH_OPEN_ADMINISTRATIVELY_PROHIBITED;
    int rc;

    if(listen_state->state == libssh2_NB_state_idle) {
        size_t offset = strlen("forwarded-tcpip") + 5;
        size_t temp_len = 0;
        struct string_buf buf;
        buf.data = data;
        buf.dataptr = buf.data;
        buf.len = datalen;

        if(datalen < offset) {
            return _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                  "Unexpected packet size");
        }

        buf.dataptr += offset;

        if(_libssh2_get_u32(&buf, &(listen_state->sender_channel))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting channel");
        }
        if(_libssh2_get_u32(&buf, &(listen_state->initial_window_size))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting window size");
        }
        if(_libssh2_get_u32(&buf, &(listen_state->packet_size))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting packet");
        }
        if(_libssh2_get_string(&buf, &(listen_state->host), &temp_len)) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting host");
        }
        listen_state->host_len = (uint32_t)temp_len;

        if(_libssh2_get_u32(&buf, &(listen_state->port))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting port");
        }
        if(_libssh2_get_string(&buf, &(listen_state->shost), &temp_len)) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting shost");
        }
        listen_state->shost_len = (uint32_t)temp_len;

        if(_libssh2_get_u32(&buf, &(listen_state->sport))) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Data too short extracting sport");
        }

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Remote received connection from %s:%u to %s:%u",
                       listen_state->shost, listen_state->sport,
                       listen_state->host, listen_state->port));

        listen_state->state = libssh2_NB_state_allocated;
    }

    if(listen_state->state != libssh2_NB_state_sent) {
        while(listn) {
            if((listn->port == (int) listen_state->port) &&
                (strlen(listn->host) == listen_state->host_len) &&
                (memcmp(listn->host, listen_state->host,
                        listen_state->host_len) == 0)) {
                /* This is our listener */
                LIBSSH2_CHANNEL *channel = NULL;
                listen_state->channel = NULL;

                if(listen_state->state == libssh2_NB_state_allocated) {
                    if(listn->queue_maxsize &&
                        (listn->queue_maxsize <= listn->queue_size)) {
                        /* Queue is full */
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                                       "Listener queue full, ignoring"));
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }

                    channel = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_CHANNEL));
                    if(!channel) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate a channel for "
                                       "new connection");
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }
                    listen_state->channel = channel;

                    channel->session = session;
                    channel->channel_type_len = strlen("forwarded-tcpip");
                    channel->channel_type = LIBSSH2_ALLOC(session,
                                                          channel->
                                                          channel_type_len +
                                                          1);
                    if(!channel->channel_type) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate a channel for new"
                                       " connection");
                        LIBSSH2_FREE(session, channel);
                        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                        listen_state->state = libssh2_NB_state_sent;
                        break;
                    }
                    memcpy(channel->channel_type, "forwarded-tcpip",
                           channel->channel_type_len + 1);

                    channel->remote.id = listen_state->sender_channel;
                    channel->remote.window_size_initial =
                        LIBSSH2_CHANNEL_WINDOW_DEFAULT;
                    channel->remote.window_size =
                        LIBSSH2_CHANNEL_WINDOW_DEFAULT;
                    channel->remote.packet_size =
                        LIBSSH2_CHANNEL_PACKET_DEFAULT;

                    channel->local.id = _libssh2_channel_nextid(session);
                    channel->local.window_size_initial =
                        listen_state->initial_window_size;
                    channel->local.window_size =
                        listen_state->initial_window_size;
                    channel->local.packet_size = listen_state->packet_size;

                    _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                                   "Connection queued: channel %u/%u "
                                   "win %u/%u packet %u/%u",
                                   channel->local.id, channel->remote.id,
                                   channel->local.window_size,
                                   channel->remote.window_size,
                                   channel->local.packet_size,
                                   channel->remote.packet_size));

                    p = listen_state->packet;
                    *(p++) = SSH_MSG_CHANNEL_OPEN_CONFIRMATION;
                    _libssh2_store_u32(&p, channel->remote.id);
                    _libssh2_store_u32(&p, channel->local.id);
                    _libssh2_store_u32(&p,
                                       channel->remote.window_size_initial);
                    _libssh2_store_u32(&p, channel->remote.packet_size);

                    listen_state->state = libssh2_NB_state_created;
                }

                if(listen_state->state == libssh2_NB_state_created) {
                    rc = _libssh2_transport_send(session, listen_state->packet,
                                                 17, NULL, 0);
                    if(rc == LIBSSH2_ERROR_EAGAIN)
                        return rc;
                    else if(rc) {
                        listen_state->state = libssh2_NB_state_idle;
                        return _libssh2_error(session, rc,
                                              "Unable to send channel "
                                              "open confirmation");
                    }

                    /* Link the channel into the end of the queue list */
                    if(listen_state->channel) {
                        _libssh2_list_add(&listn->queue,
                                          &listen_state->channel->node);
                        listn->queue_size++;
                    }

                    listen_state->state = libssh2_NB_state_idle;
                    return 0;
                }
            }

            listn = _libssh2_list_next(&listn->node);
        }

        listen_state->state = libssh2_NB_state_sent;
    }

    /* We're not listening to you */
    p = listen_state->packet;
    *(p++) = SSH_MSG_CHANNEL_OPEN_FAILURE;
    _libssh2_store_u32(&p, listen_state->sender_channel);
    _libssh2_store_u32(&p, failure_code);
    _libssh2_store_str(&p, FwdNotReq, strlen(FwdNotReq));
    _libssh2_htonu32(p, 0);

    rc = _libssh2_transport_send(session, listen_state->packet,
                                 packet_len, NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }
    else if(rc) {
        listen_state->state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc, "Unable to send open failure");

    }
    listen_state->state = libssh2_NB_state_idle;
    return 0;
}